

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTetra>::SetIntegrationRule
          (TPZCompElHDiv<pzshape::TPZShapeTetra> *this,int ord)

{
  TPZManVector<int,_3> order;
  TPZVec<int> local_58;
  int local_38;
  int local_34;
  int local_30;
  
  TPZVec<int>::TPZVec(&local_58,0);
  local_58._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_58.fNElements = 3;
  local_58.fNAlloc = 0;
  local_58.fStore = &local_38;
  local_38 = ord;
  local_34 = ord;
  local_30 = ord;
  TPZIntTetra3D::SetOrder(&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).fIntRule,&local_58,0);
  if (local_58.fStore == &local_38) {
    local_58.fStore = (int *)0x0;
  }
  local_58.fNAlloc = 0;
  local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_58.fStore != (int *)0x0) {
    operator_delete__(local_58.fStore);
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetIntegrationRule(int ord) {
	TPZManVector<int,3> order(TSHAPE::Dimension,ord);
	this->fIntRule.SetOrder(order);
}